

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

void __thiscall duckdb::PipelineExecutor::StartOperator(PipelineExecutor *this,PhysicalOperator *op)

{
  InterruptException *this_00;
  
  if (((((this->context).client)->interrupted)._M_base._M_i & 1U) == 0) {
    OperatorProfiler::StartOperator
              (&((this->context).thread)->profiler,
               (optional_ptr<const_duckdb::PhysicalOperator,_true>)op);
    return;
  }
  this_00 = (InterruptException *)__cxa_allocate_exception(0x10);
  InterruptException::InterruptException(this_00);
  __cxa_throw(this_00,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PipelineExecutor::StartOperator(PhysicalOperator &op) {
	if (context.client.interrupted) {
		throw InterruptException();
	}
	context.thread.profiler.StartOperator(&op);
}